

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderQuadsDegenerateCase::iterate(TessellationShaderQuadsDegenerateCase *this)

{
  bool bVar1;
  NotSupportedError *this_00;
  const_reference pvVar2;
  reference value;
  float *vertex_data;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  TestError *pTVar5;
  _tessellation_shader_vertex_spacing vertex_spacing;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  _tessellation_shader_vertex_spacing vertex_spacing_01;
  MessageBuilder local_428;
  undefined1 local_2a8 [8];
  string ref_vs_mode_string;
  string base_vs_mode_string;
  float *ref_triangle_data2;
  float *ref_triangle_data1;
  _run *ref_run;
  __normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
  local_248;
  __normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
  local_240;
  __normal_iterator<const_glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
  local_238;
  _runs_const_iterator ref_run_iterator;
  float *base_triangle_data;
  iterator iStack_220;
  uint n_triangle;
  reference local_218;
  _run *base_run;
  MessageBuilder local_208;
  undefined1 local_88 [8];
  string vs_mode_string;
  _run *run;
  __normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
  local_58;
  __normal_iterator<const_glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
  local_50;
  _runs_const_iterator run_iterator;
  allocator<char> local_31;
  string local_30;
  TessellationShaderQuadsDegenerateCase *local_10;
  TessellationShaderQuadsDegenerateCase *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    run_iterator._M_current._3_1_ = 1;
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    run_iterator._M_current._3_1_ = 0;
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  local_58._M_current =
       (_run *)std::
               vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
               ::begin(&this->m_runs);
  __gnu_cxx::
  __normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run_const*,std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>>>
  ::__normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run*>
            ((__normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run_const*,std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>>>
              *)&local_50,&local_58);
  while( true ) {
    run = (_run *)std::
                  vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
                  ::end(&this->m_runs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
                        *)&run);
    if (!bVar1) break;
    vs_mode_string.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
         ::operator*(&local_50);
    if (((reference)vs_mode_string.field_2._8_8_)->n_vertices != 6) {
      TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                ((string *)local_88,
                 (TessellationShaderUtils *)
                 (ulong)((reference)vs_mode_string.field_2._8_8_)->vertex_spacing,vertex_spacing);
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_208,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_208,(char (*) [32])"Invalid number of coordinates (");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)(vs_mode_string.field_2._8_8_ + 0x38))
      ;
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [119])
                                 ", instead of 6) was generated for the following tessellation configuration: primitive mode:quads, vertex spacing mode:"
                         );
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_88);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [28])0x2b0cded);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)vs_mode_string.field_2._8_8_);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)(vs_mode_string.field_2._8_8_ + 4));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [28])0x2b0ce0b);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)(vs_mode_string.field_2._8_8_ + 8));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)(vs_mode_string.field_2._8_8_ + 0xc))
      ;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(float *)(vs_mode_string.field_2._8_8_ + 0x10));
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(float *)(vs_mode_string.field_2._8_8_ + 0x14));
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_208);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid number of coordinates was generated for at least one run",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                 ,0xf9);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    base_run = (_run *)__gnu_cxx::
                       __normal_iterator<const_glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
                       ::operator++(&local_50,0);
  }
  iStack_220 = std::
               vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
               ::begin(&this->m_runs);
  local_218 = __gnu_cxx::
              __normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
              ::operator*(&stack0xfffffffffffffde0);
  base_triangle_data._4_4_ = 0;
  do {
    if (local_218->n_vertices / 3 <= base_triangle_data._4_4_) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&local_218->data,0);
    ref_run_iterator._M_current = (_run *)(pvVar2 + (ulong)(base_triangle_data._4_4_ * 9) * 4);
    local_248._M_current =
         (_run *)std::
                 vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
                 ::begin(&this->m_runs);
    local_240 = __gnu_cxx::
                __normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
                ::operator+(&local_248,1);
    __gnu_cxx::
    __normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run_const*,std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>>>
    ::__normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run*>
              ((__normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run_const*,std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>>>
                *)&local_238,&local_240);
    while( true ) {
      ref_run = (_run *)std::
                        vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
                        ::end(&this->m_runs);
      bVar1 = __gnu_cxx::operator!=
                        (&local_238,
                         (__normal_iterator<glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
                          *)&ref_run);
      if (!bVar1) break;
      value = __gnu_cxx::
              __normal_iterator<const_glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
              ::operator*(&local_238);
      vertex_data = (float *)std::vector<char,_std::allocator<char>_>::operator[](&value->data,0);
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&value->data,0);
      bVar1 = TessellationShaderUtils::isTriangleDefined
                        ((ref_run_iterator._M_current)->inner,vertex_data);
      if (!bVar1) {
        bVar1 = TessellationShaderUtils::isTriangleDefined
                          ((ref_run_iterator._M_current)->inner,(float *)(pvVar2 + 0x24));
        if (!bVar1) {
          TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                    ((string *)((long)&ref_vs_mode_string.field_2 + 8),
                     (TessellationShaderUtils *)(ulong)local_218->vertex_spacing,vertex_spacing_00);
          TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                    ((string *)local_2a8,(TessellationShaderUtils *)(ulong)value->vertex_spacing,
                     vertex_spacing_01);
          pTVar3 = tcu::TestContext::getLog
                             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_428,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (&local_428,
                              (char (*) [166])
                              "Reference run does not contain a triangle found in a base run generated for the following tessellation configuration: primitive mode:quads, base vertex spacing mode:"
                             );
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&ref_vs_mode_string.field_2 + 8));
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [33])0x2b0cc81);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_218->inner);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_218->inner + 1);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [33])0x2b0cca3);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_218->outer);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_218->outer + 1);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_218->outer + 2);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_218->outer + 3);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(char (*) [31])"reference vertex spacing mode:");
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_2a8);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [38])0x2b0ccc5);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value->inner);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value->inner + 1);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [38])0x2b0ccec);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value->outer);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value->outer + 1);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value->outer + 2);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value->outer + 3);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_428);
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"Reference run does not contain a triangle found in a base run",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                     ,299);
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_glcts::TessellationShaderQuadsDegenerateCase::_run_*,_std::vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>_>
      ::operator++(&local_238,0);
    }
    base_triangle_data._4_4_ = base_triangle_data._4_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderQuadsDegenerateCase::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize the test */
	initTest();

	/* Iterate through all runs */

	/* The test fails if any of the runs did not generate exactly 6 coordinates */
	for (_runs_const_iterator run_iterator = m_runs.begin(); run_iterator != m_runs.end(); run_iterator++)
	{
		const _run& run = *run_iterator;

		if (run.n_vertices != (2 /* triangles */ * 3 /* vertices */))
		{
			std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid number of coordinates (" << run.n_vertices
							   << ", instead of 6)"
								  " was generated for the following tessellation configuration: "
								  "primitive mode:quads, "
								  "vertex spacing mode:"
							   << vs_mode_string << " inner tessellation levels:" << run.inner[0] << ", "
							   << run.inner[1] << " outer tessellation levels:" << run.outer[0] << ", " << run.outer[1]
							   << ", " << run.outer[2] << ", " << run.outer[3] << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid number of coordinates was generated for at least one run");
		}
	} /* for (all runs) */

	/* All runs should generate exactly the same set of triangles.
	 *
	 * Note: we must not assume any specific vertex ordering, so we cannot
	 *       just do a plain memcmp() here.
	 */
	const _run& base_run = *m_runs.begin();

	for (unsigned int n_triangle = 0; n_triangle < base_run.n_vertices / 3 /* vertices per triangle */; n_triangle++)
	{
		const float* base_triangle_data = (const float*)(&base_run.data[0]) +
										  3		  /* vertices per triangle */
											  * 3 /* components */
											  * n_triangle;

		for (_runs_const_iterator ref_run_iterator = m_runs.begin() + 1; ref_run_iterator != m_runs.end();
			 ref_run_iterator++)
		{
			const _run& ref_run = *ref_run_iterator;

			const float* ref_triangle_data1 = (const float*)(&ref_run.data[0]);
			const float* ref_triangle_data2 =
				(const float*)(&ref_run.data[0]) + 3 /* vertices per triangle */ * 3 /* components */;

			if (!TessellationShaderUtils::isTriangleDefined(base_triangle_data, ref_triangle_data1) &&
				!TessellationShaderUtils::isTriangleDefined(base_triangle_data, ref_triangle_data2))
			{
				std::string base_vs_mode_string =
					TessellationShaderUtils::getESTokenForVertexSpacingMode(base_run.vertex_spacing);
				std::string ref_vs_mode_string =
					TessellationShaderUtils::getESTokenForVertexSpacingMode(ref_run.vertex_spacing);

				m_testCtx.getLog() << tcu::TestLog::Message
								   << "Reference run does not contain a triangle found in a base run"
									  " generated for the following tessellation configuration: "
									  "primitive mode:quads, "
									  "base vertex spacing mode:"
								   << base_vs_mode_string << " base inner tessellation levels:" << base_run.inner[0]
								   << ", " << base_run.inner[1]
								   << " base outer tessellation levels:" << base_run.outer[0] << ", "
								   << base_run.outer[1] << ", " << base_run.outer[2] << ", " << base_run.outer[3]
								   << "reference vertex spacing mode:" << ref_vs_mode_string
								   << " reference inner tessellation levels:" << ref_run.inner[0] << ", "
								   << ref_run.inner[1] << " reference outer tessellation levels:" << ref_run.outer[0]
								   << ", " << ref_run.outer[1] << ", " << ref_run.outer[2] << ", " << ref_run.outer[3]
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Reference run does not contain a triangle found in a base run");
			}
		} /* for (all reference runs) */
	}	 /* for (all triangles) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}